

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_image.cxx
# Opt level: O1

int __thiscall
Fl_PostScript_Graphics_Driver::alpha_mask
          (Fl_PostScript_Graphics_Driver *this,uchar *data,int w,int h,int D,int LD)

{
  short *psVar1;
  int iVar2;
  bool bVar3;
  short sVar4;
  int iVar5;
  int iVar6;
  uchar *puVar7;
  void *__s;
  void *__s_00;
  int iVar8;
  long lVar9;
  short sVar10;
  short sVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  void *pvVar15;
  short sVar16;
  uint uVar17;
  bool bVar18;
  int iVar19;
  long lVar20;
  long lVar21;
  byte bVar22;
  int iVar23;
  bool bVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  int iVar28;
  long lVar29;
  bool bVar30;
  
  this->mask = (uchar *)0x0;
  iVar19 = 0;
  if ((D - (D >> 0x1f) & 0xfffffffeU) == D) {
    uVar26 = (ulong)(uint)w;
    iVar5 = D * w + LD;
    bVar30 = 0 < h;
    if (h < 1) {
      bVar18 = true;
      bVar3 = true;
    }
    else {
      iVar12 = 0;
      bVar3 = false;
      bVar18 = false;
      iVar19 = D;
      do {
        if (w < 1) {
          bVar24 = true;
        }
        else {
          bVar24 = false;
          uVar27 = uVar26;
          iVar28 = iVar19;
          do {
            if (data[(long)iVar28 + -1] == 0xff) {
              bVar18 = true;
            }
            else if (data[(long)iVar28 + -1] == '\0') {
              bVar3 = true;
            }
            else {
              bVar24 = true;
            }
            iVar28 = iVar28 + D;
            uVar27 = uVar27 - 1;
          } while (uVar27 != 0);
          bVar24 = !bVar24;
        }
        if (!bVar24) break;
        iVar12 = iVar12 + 1;
        iVar19 = iVar19 + iVar5;
        bVar30 = iVar12 < h;
      } while (iVar12 != h);
      bVar3 = !bVar3;
      bVar18 = !bVar18;
    }
    if (bVar30) {
      iVar19 = (w - (w + 1 >> 0x1f)) + 1 >> 1;
      uVar17 = h * iVar19 * 4;
      puVar7 = (uchar *)operator_new__((long)(int)uVar17);
      this->mask = puVar7;
      if (0 < (int)uVar17) {
        uVar27 = 0;
        do {
          this->mask[uVar27] = '\0';
          uVar27 = uVar27 + 1;
        } while (uVar17 != uVar27);
      }
      uVar17 = w * 4;
      this->mx = uVar17;
      this->my = h * 4;
      uVar27 = 0xffffffffffffffff;
      if (-1 < w) {
        uVar27 = (long)(w * 4 + 2) * 2;
      }
      __s = operator_new__(uVar27);
      __s_00 = operator_new__(uVar27);
      if (-1 < w) {
        uVar13 = 1;
        if (1 < (int)(uVar17 | 2)) {
          uVar13 = uVar17 | 2;
        }
        memset(__s_00,0,(ulong)(uVar13 * 2));
      }
      if (-1 < w) {
        uVar13 = 1;
        if (1 < (int)(uVar17 | 2)) {
          uVar13 = uVar17 | 2;
        }
        memset(__s,0,(ulong)(uVar13 * 2));
      }
      if (0 < h) {
        lVar9 = (long)w;
        iVar12 = 0;
        do {
          iVar6 = iVar12 * iVar5 + D;
          iVar28 = 0;
          do {
            *(undefined2 *)((long)__s + 2) = 0;
            if (0 < w) {
              bVar22 = 0;
              uVar27 = 0;
              pvVar15 = __s;
              lVar25 = (long)__s_00 + 4;
              do {
                lVar20 = 0;
                do {
                  sVar10 = (ushort)data[(long)((int)uVar27 * D + iVar6) + -1] +
                           *(short *)(lVar25 + -2 + lVar20 * 2);
                  if (0x7f < sVar10) {
                    this->mask
                    [(ulong)((uint)(uVar27 >> 1) & 0x1fffffff) +
                     (ulong)(uint)((iVar12 * 4 + iVar28) * iVar19)] =
                         this->mask
                         [(ulong)((uint)(uVar27 >> 1) & 0x1fffffff) +
                          (ulong)(uint)((iVar12 * 4 + iVar28) * iVar19)] |
                         '\x01' << ((bVar22 & 7) + (char)lVar20 & 0x1f);
                    sVar10 = sVar10 + -0xff;
                  }
                  iVar8 = (int)sVar10;
                  iVar2 = iVar8 * 7;
                  iVar23 = iVar8 * 3;
                  sVar16 = *(short *)((long)pvVar15 + lVar20 * 2);
                  if (sVar10 < 1) {
                    iVar14 = iVar23 + 7;
                    if (-1 < iVar23 + -8) {
                      iVar14 = iVar23 + -8;
                    }
                    sVar11 = (short)(iVar14 >> 4);
                    iVar23 = iVar2 + 7;
                    if (-1 < iVar2 + -8) {
                      iVar23 = iVar2 + -8;
                    }
                    psVar1 = (short *)(lVar25 + lVar20 * 2);
                    sVar4 = (short)(iVar23 >> 4);
                    *psVar1 = *psVar1 + sVar4;
                    *(short *)((long)pvVar15 + lVar20 * 2) = sVar16 + sVar11;
                    uVar17 = iVar8 + 7;
                    if (-1 < (int)(iVar8 - 8U)) {
                      uVar17 = iVar8 - 8U;
                    }
                  }
                  else {
                    sVar11 = (short)(iVar23 + 8U >> 4);
                    psVar1 = (short *)(lVar25 + lVar20 * 2);
                    sVar4 = (short)(iVar2 + 8U >> 4);
                    *psVar1 = *psVar1 + sVar4;
                    *(short *)((long)pvVar15 + lVar20 * 2) = sVar16 + sVar11;
                    uVar17 = (uint)(ushort)(sVar10 + 8);
                  }
                  sVar16 = (short)(uVar17 >> 4);
                  *(short *)((long)pvVar15 + lVar20 * 2 + 4) = sVar16;
                  psVar1 = (short *)((long)pvVar15 + lVar20 * 2 + 2);
                  *psVar1 = *psVar1 + (sVar10 - (sVar16 + sVar11 + sVar4));
                  lVar20 = lVar20 + 1;
                } while (lVar20 != 4);
                uVar27 = uVar27 + 1;
                bVar22 = (bVar22 & 7) + 4;
                pvVar15 = (void *)((long)pvVar15 + 8);
                lVar25 = lVar25 + 8;
              } while (uVar27 != uVar26);
            }
            *(undefined2 *)((long)__s_00 + 2) = 0;
            if (0 < w) {
              lVar25 = (long)__s_00 + lVar9 * 8 + 2;
              lVar20 = (long)__s + lVar9 * 8 + -2;
              lVar29 = lVar9;
              bVar22 = (char)w * '\x04' - 4U | 3;
              uVar17 = w * 4 - 4U | 3;
              do {
                lVar21 = 0;
                do {
                  sVar10 = (ushort)data[(long)((int)(lVar29 + -1) * D + iVar6) + -1] +
                           *(short *)(lVar20 + 2 + lVar21 * 2);
                  if (0x7f < sVar10) {
                    this->mask
                    [(ulong)(uVar17 + (int)lVar21 >> 3) +
                     (ulong)(uint)((iVar12 * 4 + iVar28 + 1) * iVar19)] =
                         this->mask
                         [(ulong)(uVar17 + (int)lVar21 >> 3) +
                          (ulong)(uint)((iVar12 * 4 + iVar28 + 1) * iVar19)] |
                         '\x01' << (bVar22 + (char)lVar21 & 7);
                    sVar10 = sVar10 + -0xff;
                  }
                  iVar8 = (int)sVar10;
                  iVar2 = iVar8 * 7;
                  iVar23 = iVar8 * 3;
                  if (sVar10 < 1) {
                    iVar14 = iVar23 + 7;
                    if (-1 < iVar23 + -8) {
                      iVar14 = iVar23 + -8;
                    }
                    psVar1 = (short *)(lVar25 + lVar21 * 2);
                    sVar16 = (short)(iVar14 >> 4);
                    *psVar1 = *psVar1 + sVar16;
                    iVar23 = iVar2 + 7;
                    if (-1 < iVar2 + -8) {
                      iVar23 = iVar2 + -8;
                    }
                    psVar1 = (short *)(lVar20 + lVar21 * 2);
                    sVar11 = (short)(iVar23 >> 4);
                    *psVar1 = *psVar1 + sVar11;
                    uVar13 = iVar8 + 7;
                    if (-1 < (int)(iVar8 - 8U)) {
                      uVar13 = iVar8 - 8U;
                    }
                  }
                  else {
                    psVar1 = (short *)(lVar25 + lVar21 * 2);
                    sVar16 = (short)(iVar23 + 8U >> 4);
                    *psVar1 = *psVar1 + sVar16;
                    psVar1 = (short *)(lVar20 + lVar21 * 2);
                    sVar11 = (short)(iVar2 + 8U >> 4);
                    *psVar1 = *psVar1 + sVar11;
                    uVar13 = (uint)(ushort)(sVar10 + 8);
                  }
                  sVar4 = (short)(uVar13 >> 4);
                  *(short *)(lVar25 + -4 + lVar21 * 2) = sVar4;
                  psVar1 = (short *)(lVar25 + -2 + lVar21 * 2);
                  *psVar1 = *psVar1 + (sVar10 - (sVar4 + sVar16 + sVar11));
                  lVar21 = lVar21 + -1;
                } while (lVar21 != -4);
                lVar25 = lVar25 + -8;
                bVar22 = bVar22 - 4;
                uVar17 = uVar17 - 4;
                lVar20 = lVar20 + -8;
                bVar30 = 1 < lVar29;
                lVar29 = lVar29 + -1;
              } while (bVar30);
            }
            bVar30 = iVar28 == 0;
            iVar28 = iVar28 + 2;
          } while (bVar30);
          iVar12 = iVar12 + 1;
        } while (iVar12 != h);
      }
      operator_delete__(__s);
      operator_delete__(__s_00);
      iVar19 = 0;
    }
    else {
      iVar19 = 0;
      if (!bVar3) {
        if (bVar18) {
          this->mask = (uchar *)0x0;
          iVar19 = 1;
        }
        else {
          iVar12 = w + 0xe;
          if (-1 < w + 7) {
            iVar12 = w + 7;
          }
          uVar17 = (iVar12 >> 3) * h;
          puVar7 = (uchar *)operator_new__((long)(int)uVar17);
          this->mask = puVar7;
          if (0 < (int)uVar17) {
            uVar27 = 0;
            do {
              this->mask[uVar27] = '\0';
              uVar27 = uVar27 + 1;
            } while (uVar17 != uVar27);
          }
          if (0 < h) {
            iVar6 = 0;
            iVar28 = D;
            do {
              if (0 < w) {
                uVar27 = 0;
                iVar23 = iVar28;
                do {
                  if (data[(long)iVar23 + -1] != '\0') {
                    this->mask[(uVar27 >> 3 & 0x1fffffff) + (ulong)(uint)(iVar6 * (iVar12 >> 3))] =
                         this->mask
                         [(uVar27 >> 3 & 0x1fffffff) + (ulong)(uint)(iVar6 * (iVar12 >> 3))] |
                         '\x01' << ((byte)uVar27 & 7);
                  }
                  uVar27 = uVar27 + 1;
                  iVar23 = iVar23 + D;
                } while (uVar26 != uVar27);
              }
              iVar6 = iVar6 + 1;
              iVar28 = iVar28 + iVar5;
            } while (iVar6 != h);
          }
          this->mx = w;
          this->my = h;
        }
      }
    }
  }
  return iVar19;
}

Assistant:

int Fl_PostScript_Graphics_Driver::alpha_mask(const uchar * data, int w, int h, int D, int LD){

  mask = 0;
  if ((D/2)*2 != D){ //no mask info
    return 0;
  }
  int xx;
  int i,j, k, l;
  LD += w*D;
  int V255=0;
  int V0 =0;
  int V_=0;
  for (j=0;j<h;j++){
    for (i=0;i<w;i++)
      switch(data[j*LD+D*i+D-1]){
        case 255: V255 = 1; break;
        case 0: V0 = 1; break;
        default: V_= 1;
      }
    if (V_) break;
  };
  if (!V_){
    if (V0)
      if (V255){// not true alpha, only masking
        xx = (w+7)/8;
        mask = new uchar[h * xx];
        for (i=0;i<h * xx;i++) mask[i]=0;
        for (j=0;j<h;j++)
          for (i=0;i<w;i++)
            if (data[j*LD+D*i+D-1])
              mask[j*xx+i/8] |= 1 << (i % 8);
        mx = w;
        my = h; //mask imensions
        return 0;
      } else {
        mask=0;
        return 1; //everything masked
      }
    else
      return 0;
  }



  /////   Alpha dither, generating (4*w) * 4 mask area       /////
  /////         with Floyd-Steinberg error diffusion         /////

  mask = new uchar[((w+1)/2) * h * 4];

  for (i = 0; i<((w+1)/2) * h * 4; i++) mask[i] = 0; //cleaning



  mx= w*4;
  my=h*4; // mask dimensions

  xx = (w+1)/2;                //  mask line width in bytes

  short * errors1 = new short [w*4+2]; //  two rows of dither errors
  short * errors2 = new short [w*4+2]; //  two rows of dither errors

  for (i=0; i<w*4+2; i++) errors2[i] = 0; // cleaning,after first swap will become current
  for (i=0; i<w*4+2; i++) errors1[i] = 0; // cleaning,after first swap will become current

  short * current = errors1;
  short * next = errors2;
  short * swap;

  for (j=0; j<h; j++){
    for (l=0; l<4; ){           // generating 4 rows of mask lines for 1 RGB line
      int jj = j*4+l;

      /// mask row index
      swap = next;
      next = current;
      current = swap;
      *(next+1) = 0;          // must clean the first cell, next are overriden by *1
      for (i=0; i<w; i++){
        for (k=0; k<4; k++){   // generating 4 x-pixels for 1 RGB
          short error, o1, o2, o3;
          int ii = i*4+k;   // mask cell index
          short val = data[j*LD+D*i+D-1] + current[1+ii];
          if (val>127){
            mask[jj*xx+ii/8]  |= 1 << (ii % 8); //set mask bit
            error =  val-255;
          }else
            error = val;

          ////// error spreading /////
          if (error >0){
            next[ii] +=  o1 = (error * 3 + 8)/16;
            current[ii+2] += o2 = (error * 7 + 8)/16;
            next[ii+2] = o3 =(error + 8)/16;  // *1 - ok replacing (cleaning)
          } else {
            next[ii] += o1 = (error * 3 - 8)/16;
            current[ii+2] += o2 = (error * 7 - 8)/16;
            next[ii+2] = o3 = (error - 8)/16;
          }
          next[1+ii] += error - o1 - o2 - o3;
        }
      }
      l++;

      ////// backward

      jj = j*4+l;
      swap = next;
      next = current;
      current = swap;
      *(next+1) = 0;          // must clean the first cell, next are overriden by *1

      for (i = w-1; i >= 0; i--){

        for (k=3; k>=0; k--){   // generating 4 x-pixels for 1 RGB
          short error, o1, o2, o3;

          int ii = i*4+k;   // mask cell index
          short val = data[j*LD+D*i+D-1] + current[1+ii];
          if (val>127){

            mask[jj*xx+ii/8]  |= 1 << (ii % 8); //set mask bit
            error =  val-255;
          } else
            error = val;

          ////// error spreading /////
          if (error >0){
            next[ii+2] +=  o1 = (error * 3 + 8)/16;
            current[ii] += o2 = (error * 7 + 8)/16;
            next[ii] = o3 =(error + 8)/16;  // *1 - ok replacing (cleaning)
          } else {
            next[ii+2] += o1 = (error * 3 - 8)/16;

            current[ii] += o2 = (error * 7 - 8)/16;
            next[ii] = o3 = (error - 8)/16;
          }
          next[1+ii] += error - o1 - o2 - o3;
        }
      }
      l++;
    }
  }
  delete[] errors1;
  delete[] errors2;
  return 0;
}